

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTest.c
# Opt level: O2

void Gia_ParTestSimulate2(Gia_Man_t *p,int nWords,int nProcs)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj;
  long lVar4;
  ulong uVar5;
  Par_ThData_t *__arg;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  Par_ThData_t ThData [100];
  pthread_t WorkerThread [100];
  
  if (100 < nProcs) {
    __assert_fail("nProcs <= PAR_THR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0xf2,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
  }
  Gia_ManRandom(1);
  Gia_ParTestAlloc(p,nWords);
  Gia_ParTestSimulateInit(p);
  p_01 = Vec_IntAlloc(1000);
  iVar10 = p->vCis->nSize;
  while (0 < iVar10) {
    iVar10 = iVar10 + -1;
    iVar2 = Vec_IntEntry(p->vCis,iVar10);
    Vec_IntPush(p_01,iVar2);
  }
  uVar9 = 0;
  Vec_IntPush(p_01,0);
  Gia_ManStaticFanoutStart(p);
  p_02 = Gia_ManCreateFaninCounts(p);
  uVar8 = p_02->nSize;
  uVar5 = 0;
  if (0 < (int)uVar8) {
    uVar5 = (ulong)uVar8;
  }
  iVar10 = 0;
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    iVar10 = iVar10 + p_02->pArray[uVar9];
  }
  uVar9 = 0;
  if (0 < nProcs) {
    uVar9 = (ulong)(uint)nProcs;
  }
  __arg = ThData;
  lVar4 = 0;
  while (uVar9 * 8 + 8 != lVar4 + 8) {
    __arg->p = p;
    __arg->Id = -1;
    __arg->Status = 0;
    iVar2 = pthread_create((pthread_t *)((long)WorkerThread + lVar4),(pthread_attr_t *)0x0,
                           Gia_ParWorkerThread,__arg);
    __arg = __arg + 1;
    lVar4 = lVar4 + 8;
    if (iVar2 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                    ,0x104,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
    }
  }
  while ((0 < iVar10 || (0 < p_01->nSize))) {
    for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
      if (ThData[uVar6].Status == 0) {
        iVar2 = ThData[uVar6].Id;
        if (-1 < iVar2) {
          for (iVar7 = 0; iVar2 = Vec_IntEntry(p->vFanoutNums,iVar2), iVar7 < iVar2;
              iVar7 = iVar7 + 1) {
            p_00 = p->vFanout;
            iVar2 = Vec_IntEntry(p_00,ThData[uVar6].Id);
            uVar3 = Vec_IntEntry(p_00,iVar2 + iVar7);
            iVar2 = Vec_IntEntry(p_02,uVar3);
            if (iVar2 < 1) {
              __assert_fail("Vec_IntEntry(vFanins, iFan) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x111,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            if (((int)uVar3 < 0) || ((int)uVar8 <= (int)uVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = p_02->pArray + uVar3;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Vec_IntPush(p_01,uVar3);
            }
            if (iVar10 < 1) {
              __assert_fail("nCountFanins > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x114,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            iVar10 = iVar10 + -1;
            iVar2 = ThData[uVar6].Id;
          }
          ThData[uVar6].Id = -1;
        }
        if (0 < p_01->nSize) {
          uVar3 = p_01->nSize - 1;
          p_01->nSize = uVar3;
          ThData[uVar6].Id = p_01->pArray[uVar3];
          ThData[uVar6].Status = 1;
        }
      }
    }
  }
  for (uVar8 = 0; (uint)uVar5 != uVar8; uVar8 = uVar8 + 1) {
    uVar3 = Vec_IntEntry(p_02,uVar8);
    if (uVar3 != 0) {
      printf("%d -> %d    ",(ulong)uVar8,(ulong)uVar3);
      pObj = Gia_ManObj(p,uVar8);
      Gia_ObjPrint(p,pObj);
    }
  }
  uVar5 = 0;
LAB_00342116:
  do {
    iVar10 = (int)uVar9;
    if (uVar5 != uVar9) {
      if (ThData[uVar5].Status == 0) {
        uVar5 = uVar5 + 1;
        goto LAB_00342116;
      }
      iVar10 = (int)uVar5;
    }
    uVar5 = 0;
    if (iVar10 == nProcs) {
      lVar4 = 0;
      while( true ) {
        if (uVar9 << 4 == lVar4) {
          Gia_ManStaticFanoutStop(p);
          Vec_IntFree(p_01);
          Vec_IntFree(p_02);
          Gia_ParTestFree(p);
          return;
        }
        if (*(int *)((long)&ThData[0].Status + lVar4) != 0) break;
        *(undefined8 *)((long)&ThData[0].Id + lVar4) = 0x1ffffffff;
        lVar4 = lVar4 + 0x10;
      }
      __assert_fail("ThData[i].Status == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                    ,0x132,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
    }
  } while( true );
}

Assistant:

void Gia_ParTestSimulate2( Gia_Man_t * p, int nWords, int nProcs )
{
	pthread_t WorkerThread[PAR_THR_MAX];
    Par_ThData_t ThData[PAR_THR_MAX];
    Vec_Int_t * vStack, * vFanins;
    int i, k, iFan, status, nCountFanins;
    assert( nProcs <= PAR_THR_MAX );
    Gia_ManRandom( 1 );
    Gia_ParTestAlloc( p, nWords );
    Gia_ParTestSimulateInit( p );
    // start the stack
    vStack = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryReverse( p->vCis, iFan, i )
        Vec_IntPush( vStack, iFan );
    Vec_IntPush( vStack, 0 );
    Gia_ManStaticFanoutStart( p );
    vFanins = Gia_ManCreateFaninCounts( p );
    nCountFanins = Vec_IntSum(vFanins);
    // start the threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p = p;
        ThData[i].Id = -1;
        ThData[i].Status = 0;
        status = pthread_create( WorkerThread + i, NULL, Gia_ParWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    while ( nCountFanins > 0 || Vec_IntSize(vStack) > 0 )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].Status )
                continue;
            assert( ThData[i].Status == 0 );
            if ( ThData[i].Id >= 0 )
            {
                Gia_ObjForEachFanoutStaticId( p, ThData[i].Id, iFan, k )
                {
                    assert( Vec_IntEntry(vFanins, iFan) > 0 );
                    if ( Vec_IntAddToEntry(vFanins, iFan, -1) == 0 )
                        Vec_IntPush( vStack, iFan );
                    assert( nCountFanins > 0 );
                    nCountFanins--;
                }
                ThData[i].Id = -1;
            }
            if ( Vec_IntSize(vStack) > 0 )
            {
                ThData[i].Id = Vec_IntPop( vStack );
                ThData[i].Status = 1;
            }
        }
    }
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( iFan != 0 )
        {
            printf( "%d -> %d    ", k, iFan );
            Gia_ObjPrint( p, Gia_ManObj(p, k) );
        }
//    assert( Vec_IntSum(vFanins) == 0 );
    // stop the threads
    while ( 1 )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].Status )
                break;
        if ( i == nProcs )
            break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        assert( ThData[i].Status == 0 );
        ThData[i].Id = -1;
        ThData[i].Status = 1;
    }
    Gia_ManStaticFanoutStop( p );
    Vec_IntFree( vStack );
    Vec_IntFree( vFanins );
//    Gia_ParComputeSignature( p, nWords ); printf( "   " );
    Gia_ParTestFree( p );
}